

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

bool QFontDatabase::hasFamily(QString *family)

{
  long lVar1;
  QtFontFamily *pQVar2;
  int iVar3;
  QFontDatabasePrivate *pQVar4;
  long in_FS_OFFSET;
  QtFontFamily *f;
  int i;
  QFontDatabasePrivate *d;
  QString familyAlias;
  QString foundry;
  QString parsedFamily;
  QMutexLocker<QRecursiveMutex> locker;
  QRecursiveMutex *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  QString *in_stack_ffffffffffffff78;
  int local_7c;
  bool local_61;
  QString *in_stack_ffffffffffffffa0;
  QString *in_stack_ffffffffffffffa8;
  QString *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)0x743faf);
  QString::QString((QString *)0x743fdd);
  parseFontName(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  QFontDatabasePrivate::resolveFontFamilyAlias(in_stack_ffffffffffffff78);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
              *)in_stack_ffffffffffffff68);
  QMutexLocker<QRecursiveMutex>::QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
            );
  pQVar4 = QFontDatabasePrivate::ensureFontDatabase();
  local_7c = 0;
  do {
    if (pQVar4->count <= local_7c) {
      local_61 = false;
LAB_007440f3:
      QMutexLocker<QRecursiveMutex>::~QMutexLocker
                ((QMutexLocker<QRecursiveMutex> *)CONCAT44(1,in_stack_ffffffffffffff70));
      QString::~QString((QString *)0x74410a);
      QString::~QString((QString *)0x744114);
      QString::~QString((QString *)0x74411e);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return local_61;
    }
    pQVar2 = pQVar4->families[local_7c];
    if ((((undefined1  [112])((undefined1  [112])*pQVar2 & (undefined1  [112])0x1) ==
          (undefined1  [112])0x0) || (pQVar2->count != 0)) &&
       (iVar3 = QString::compare((QString *)&stack0xffffffffffffffa0,(int)pQVar2 + 8), iVar3 == 0))
    {
      local_61 = true;
      goto LAB_007440f3;
    }
    local_7c = local_7c + 1;
  } while( true );
}

Assistant:

bool QFontDatabase::hasFamily(const QString &family)
{
    QString parsedFamily, foundry;
    parseFontName(family, foundry, parsedFamily);
    const QString familyAlias = QFontDatabasePrivate::resolveFontFamilyAlias(parsedFamily);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    for (int i = 0; i < d->count; i++) {
        QtFontFamily *f = d->families[i];
        if (f->populated && f->count == 0)
            continue;
        if (familyAlias.compare(f->name, Qt::CaseInsensitive) == 0)
            return true;
    }

    return false;
}